

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

bool __thiscall
google::protobuf::FieldDescriptorProto::MergePartialFromCodedStream
          (FieldDescriptorProto *this,CodedInputStream *input)

{
  uint8 uVar1;
  int iVar2;
  uint8 *puVar3;
  bool bVar4;
  Limit limit;
  ulong in_RAX;
  string *psVar5;
  FieldOptions *pFVar6;
  uint32 tag;
  UnknownFieldSet *unknown_fields;
  uint local_4c;
  ulong local_48;
  ulong local_40;
  UnknownFieldSet *local_38;
  
  local_38 = &this->_unknown_fields_;
  unknown_fields = local_38;
  local_48 = in_RAX;
  local_40 = in_RAX;
LAB_001ea696:
  do {
    puVar3 = input->buffer_;
    if ((puVar3 < input->buffer_end_) && (tag = (uint32)(char)*puVar3, -1 < (char)*puVar3)) {
      input->last_tag_ = tag;
      input->buffer_ = puVar3 + 1;
    }
    else {
      tag = io::CodedInputStream::ReadTagFallback(input);
      input->last_tag_ = tag;
    }
    if (tag == 0) {
      return true;
    }
    switch(tag >> 3) {
    case 1:
      if ((tag & 7) == 2) {
        *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
        if (this->name_ == (string *)internal::kEmptyString_abi_cxx11_) {
          psVar5 = (string *)operator_new(0x20);
          (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
          psVar5->_M_string_length = 0;
          (psVar5->field_2)._M_local_buf[0] = '\0';
          this->name_ = psVar5;
        }
        bVar4 = internal::WireFormatLite::ReadString(input,this->name_);
        if (!bVar4) {
          return false;
        }
        internal::WireFormat::VerifyUTF8StringFallback
                  ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,PARSE);
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (*puVar3 == '\x12')) {
          input->buffer_ = puVar3 + 1;
LAB_001ea7b8:
          *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x20;
          if (this->extendee_ == (string *)internal::kEmptyString_abi_cxx11_) {
            psVar5 = (string *)operator_new(0x20);
            (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
            psVar5->_M_string_length = 0;
            (psVar5->field_2)._M_local_buf[0] = '\0';
            this->extendee_ = psVar5;
          }
          bVar4 = internal::WireFormatLite::ReadString(input,this->extendee_);
          if (!bVar4) {
            return false;
          }
          internal::WireFormat::VerifyUTF8StringFallback
                    ((this->extendee_->_M_dataplus)._M_p,(int)this->extendee_->_M_string_length,
                     PARSE);
          puVar3 = input->buffer_;
          if ((puVar3 < input->buffer_end_) && (*puVar3 == '\x18')) {
            input->buffer_ = puVar3 + 1;
LAB_001ea82e:
            puVar3 = input->buffer_;
            if ((puVar3 < input->buffer_end_) && (uVar1 = *puVar3, -1 < (char)uVar1)) {
              input->buffer_ = puVar3 + 1;
              local_4c = (int)(char)uVar1;
            }
            else {
              bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_4c);
              if (!bVar4) {
                return false;
              }
            }
            this->number_ = local_4c;
            *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
            puVar3 = input->buffer_;
            if ((puVar3 < input->buffer_end_) && (*puVar3 == ' ')) {
              input->buffer_ = puVar3 + 1;
LAB_001ea8cf:
              puVar3 = input->buffer_;
              if ((puVar3 < input->buffer_end_) && (uVar1 = *puVar3, -1 < (char)uVar1)) {
                input->buffer_ = puVar3 + 1;
                bVar4 = true;
                local_4c = (int)(char)uVar1;
              }
              else {
                bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_4c);
              }
              if (bVar4 == false) {
                return false;
              }
              local_40 = (ulong)local_4c;
              if (local_4c - 1 < 3) {
                *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 4;
                this->label_ = local_4c;
              }
              else {
                UnknownFieldSet::AddVarint(unknown_fields,4,(long)(int)local_4c);
              }
              if (bVar4 == false) {
                return false;
              }
              puVar3 = input->buffer_;
              if ((puVar3 < input->buffer_end_) && (*puVar3 == '(')) {
                input->buffer_ = puVar3 + 1;
LAB_001ea963:
                puVar3 = input->buffer_;
                if ((puVar3 < input->buffer_end_) && (uVar1 = *puVar3, -1 < (char)uVar1)) {
                  input->buffer_ = puVar3 + 1;
                  bVar4 = true;
                  local_4c = (int)(char)uVar1;
                }
                else {
                  bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_4c);
                }
                if (bVar4 == false) {
                  return false;
                }
                local_48 = (ulong)local_4c;
                if (local_4c - 1 < 0x12) {
                  *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 8;
                  this->type_ = local_4c;
                }
                else {
                  UnknownFieldSet::AddVarint(unknown_fields,5,(long)(int)local_4c);
                }
                if (bVar4 == false) {
                  return false;
                }
                puVar3 = input->buffer_;
                if ((puVar3 < input->buffer_end_) && (*puVar3 == '2')) {
                  input->buffer_ = puVar3 + 1;
LAB_001ea9f7:
                  *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x10;
                  if (this->type_name_ == (string *)internal::kEmptyString_abi_cxx11_) {
                    psVar5 = (string *)operator_new(0x20);
                    (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
                    psVar5->_M_string_length = 0;
                    (psVar5->field_2)._M_local_buf[0] = '\0';
                    this->type_name_ = psVar5;
                  }
                  bVar4 = internal::WireFormatLite::ReadString(input,this->type_name_);
                  if (!bVar4) {
                    return false;
                  }
                  internal::WireFormat::VerifyUTF8StringFallback
                            ((this->type_name_->_M_dataplus)._M_p,
                             (int)this->type_name_->_M_string_length,PARSE);
                  puVar3 = input->buffer_;
                  if ((puVar3 < input->buffer_end_) && (*puVar3 == ':')) {
                    input->buffer_ = puVar3 + 1;
LAB_001eaa6d:
                    *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x40;
                    if (this->default_value_ == (string *)internal::kEmptyString_abi_cxx11_) {
                      psVar5 = (string *)operator_new(0x20);
                      (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
                      psVar5->_M_string_length = 0;
                      (psVar5->field_2)._M_local_buf[0] = '\0';
                      this->default_value_ = psVar5;
                    }
                    bVar4 = internal::WireFormatLite::ReadString(input,this->default_value_);
                    if (!bVar4) {
                      return false;
                    }
                    internal::WireFormat::VerifyUTF8StringFallback
                              ((this->default_value_->_M_dataplus)._M_p,
                               (int)this->default_value_->_M_string_length,PARSE);
                    puVar3 = input->buffer_;
                    if ((puVar3 < input->buffer_end_) && (*puVar3 == 'B')) {
                      input->buffer_ = puVar3 + 1;
LAB_001eaae3:
                      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x80;
                      if (this->options_ == (FieldOptions *)0x0) {
                        pFVar6 = (FieldOptions *)operator_new(0x70);
                        FieldOptions::FieldOptions(pFVar6);
                        this->options_ = pFVar6;
                      }
                      pFVar6 = this->options_;
                      puVar3 = input->buffer_;
                      if ((puVar3 < input->buffer_end_) && (uVar1 = *puVar3, -1 < (char)uVar1)) {
                        input->buffer_ = puVar3 + 1;
                        local_4c = (int)(char)uVar1;
                      }
                      else {
                        bVar4 = io::CodedInputStream::ReadVarint32Fallback(input,&local_4c);
                        if (!bVar4) {
                          return false;
                        }
                      }
                      iVar2 = input->recursion_depth_;
                      input->recursion_depth_ = iVar2 + 1;
                      if (input->recursion_limit_ <= iVar2) {
                        return false;
                      }
                      limit = io::CodedInputStream::PushLimit(input,local_4c);
                      bVar4 = FieldOptions::MergePartialFromCodedStream(pFVar6,input);
                      if (!bVar4) {
                        return false;
                      }
                      if (input->legitimate_message_end_ != true) {
                        return false;
                      }
                      io::CodedInputStream::PopLimit(input,limit);
                      if (0 < input->recursion_depth_) {
                        input->recursion_depth_ = input->recursion_depth_ + -1;
                      }
                      unknown_fields = local_38;
                      if ((input->buffer_ == input->buffer_end_) &&
                         ((input->buffer_size_after_limit_ != 0 ||
                          (input->total_bytes_read_ == input->current_limit_)))) {
                        input->last_tag_ = 0;
                        input->legitimate_message_end_ = true;
                        return true;
                      }
                    }
                  }
                }
              }
            }
          }
        }
        goto LAB_001ea696;
      }
      break;
    case 2:
      if ((tag & 7) == 2) goto LAB_001ea7b8;
      break;
    case 3:
      if ((tag & 7) == 0) goto LAB_001ea82e;
      break;
    case 4:
      if ((tag & 7) == 0) goto LAB_001ea8cf;
      break;
    case 5:
      if ((tag & 7) == 0) goto LAB_001ea963;
      break;
    case 6:
      if ((tag & 7) == 2) goto LAB_001ea9f7;
      break;
    case 7:
      if ((tag & 7) == 2) goto LAB_001eaa6d;
      break;
    case 8:
      if ((tag & 7) == 2) goto LAB_001eaae3;
    }
    if ((tag & 7) == 4) {
      return true;
    }
    bVar4 = internal::WireFormat::SkipField(input,tag,unknown_fields);
    if (!bVar4) {
      return false;
    }
  } while( true );
}

Assistant:

bool FieldDescriptorProto::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_extendee;
        break;
      }

      // optional string extendee = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_extendee:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_extendee()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->extendee().data(), this->extendee().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(24)) goto parse_number;
        break;
      }

      // optional int32 number = 3;
      case 3: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_number:
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &number_)));
          set_has_number();
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(32)) goto parse_label;
        break;
      }

      // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
      case 4: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_label:
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FieldDescriptorProto_Label_IsValid(value)) {
            set_label(static_cast< ::google::protobuf::FieldDescriptorProto_Label >(value));
          } else {
            mutable_unknown_fields()->AddVarint(4, value);
          }
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(40)) goto parse_type;
        break;
      }

      // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
      case 5: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_VARINT) {
         parse_type:
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::google::protobuf::FieldDescriptorProto_Type_IsValid(value)) {
            set_type(static_cast< ::google::protobuf::FieldDescriptorProto_Type >(value));
          } else {
            mutable_unknown_fields()->AddVarint(5, value);
          }
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(50)) goto parse_type_name;
        break;
      }

      // optional string type_name = 6;
      case 6: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_type_name:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_type_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->type_name().data(), this->type_name().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(58)) goto parse_default_value;
        break;
      }

      // optional string default_value = 7;
      case 7: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_default_value:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_default_value()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->default_value().data(), this->default_value().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(66)) goto parse_options;
        break;
      }

      // optional .google.protobuf.FieldOptions options = 8;
      case 8: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_options:
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_options()));
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}